

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::PageHeader::read(PageHeader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  undefined8 *puVar6;
  ushort *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  TProtocol *this_01;
  int16_t fid;
  int32_t ecast86;
  TType ftype;
  string fname;
  ushort local_a2;
  PageHeader *local_a0;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  type local_88;
  int local_84;
  int32_t *local_80;
  int32_t *local_78;
  int32_t *local_70;
  DataPageHeader *local_68;
  DictionaryPageHeader *local_60;
  DataPageHeaderV2 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->data_page_header_v2;
  local_60 = &this->dictionary_page_header;
  local_68 = &this->data_page_header;
  local_70 = &this->crc;
  local_78 = &this->compressed_page_size;
  local_80 = &this->uncompressed_page_size;
  local_8c = 0;
  local_94 = 0;
  local_90 = 0;
  local_a0 = this;
  do {
    __nbytes_00 = &local_a2;
    this_01 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_84);
    if (local_84 == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((byte)local_8c & (byte)local_94 & (byte)local_90 & 1) == 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar6[1] = puVar6 + 3;
        puVar6[2] = 0;
        *(undefined1 *)(puVar6 + 3) = 0;
        *puVar6 = &PTR__TException_00499898;
        *(undefined4 *)(puVar6 + 5) = 1;
        __cxa_throw(puVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar2 + iVar1);
    }
    switch(local_a2) {
    case 1:
      if (local_84 != 8) break;
      iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_88);
      local_a0->type = local_88;
      local_8c = (undefined4)CONCAT71((uint7)(uint3)(local_88 >> 8),1);
      goto LAB_002ccdb0;
    case 2:
      if (local_84 == 8) {
        iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_80);
        local_94 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
        goto LAB_002ccdb0;
      }
      break;
    case 3:
      if (local_84 == 8) {
        iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_78);
        local_90 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
        goto LAB_002ccdb0;
      }
      break;
    case 4:
      if (local_84 == 8) {
        iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_70);
        local_a0->__isset = (_PageHeader__isset)((byte)local_a0->__isset | 1);
        goto LAB_002ccdb0;
      }
      break;
    case 5:
      if (local_84 == 0xc) {
        sVar5 = DataPageHeader::read(local_68,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_a0->__isset = (_PageHeader__isset)((byte)local_a0->__isset | 2);
        goto LAB_002ccdb0;
      }
      break;
    case 6:
      if (local_84 == 0xc) {
        sVar5 = IndexPageHeader::read((IndexPageHeader *)this_01,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_a0->__isset = (_PageHeader__isset)((byte)local_a0->__isset | 4);
        goto LAB_002ccdb0;
      }
      break;
    case 7:
      if (local_84 == 0xc) {
        sVar5 = DictionaryPageHeader::read(local_60,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_a0->__isset = (_PageHeader__isset)((byte)local_a0->__isset | 8);
        goto LAB_002ccdb0;
      }
      break;
    case 8:
      if (local_84 == 0xc) {
        sVar5 = DataPageHeaderV2::read(local_58,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_a0->__isset = (_PageHeader__isset)((byte)local_a0->__isset | 0x10);
        goto LAB_002ccdb0;
      }
    }
    iVar3 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_002ccdb0:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t PageHeader::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_type = false;
  bool isset_uncompressed_page_size = false;
  bool isset_compressed_page_size = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast86;
          xfer += iprot->readI32(ecast86);
          this->type = static_cast<PageType::type>(ecast86);
          isset_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->uncompressed_page_size);
          isset_uncompressed_page_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->compressed_page_size);
          isset_compressed_page_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->crc);
          this->__isset.crc = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->data_page_header.read(iprot);
          this->__isset.data_page_header = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->index_page_header.read(iprot);
          this->__isset.index_page_header = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->dictionary_page_header.read(iprot);
          this->__isset.dictionary_page_header = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->data_page_header_v2.read(iprot);
          this->__isset.data_page_header_v2 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_type)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_uncompressed_page_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_compressed_page_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}